

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supermap.hpp
# Opt level: O2

optional<supermap::ByteArray<4096UL>_> __thiscall
supermap::Supermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>::getValue
          (Supermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *this,
          Key<128UL> *k)

{
  long *plVar1;
  _Head_base<0UL,_unsigned_char_*,_false> _Var2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  optional<supermap::ByteArray<4096UL>_> oVar5;
  optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_> foundOnDisk;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8 [128];
  _Head_base<0UL,_unsigned_char_*,_false> local_28;
  char local_20;
  
  auVar4 = (**(code **)(**(long **)((k->super_array<unsigned_char,_128UL>)._M_elems + 8) + 8))();
  _Var2._M_head_impl = (uchar *)auVar4._0_8_;
  if ((auVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_c8._M_unused._M_object = (void *)0x0;
    local_c8._8_8_ = 0;
    local_b0 = std::
               _Function_handler<bool_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&,_const_supermap::Key<128UL>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/Supermap.hpp:97:17)>
               ::_M_invoke;
    local_b8 = std::
               _Function_handler<bool_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&,_const_supermap::Key<128UL>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/Supermap.hpp:97:17)>
               ::_M_manager;
    local_e8._M_unused._M_object = (void *)0x0;
    local_e8._8_8_ = 0;
    local_d0 = std::
               _Function_handler<bool_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&,_const_supermap::Key<128UL>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/Supermap.hpp:98:17)>
               ::_M_invoke;
    local_d8 = std::
               _Function_handler<bool_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&,_const_supermap::Key<128UL>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/Supermap.hpp:98:17)>
               ::_M_manager;
    (**(code **)**(undefined8 **)((k->super_array<unsigned_char,_128UL>)._M_elems + 0x18))(local_a8)
    ;
    std::_Function_base::~_Function_base((_Function_base *)&local_e8);
    std::_Function_base::~_Function_base((_Function_base *)&local_c8);
    _Var2._M_head_impl = local_28._M_head_impl;
    if (local_20 == '\0') {
      *(undefined1 *)
       &(this->innerStorage_)._M_t.
        super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
        .
        super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_false>
        ._M_head_impl = 0;
      uVar3 = extraout_RDX;
      goto LAB_00186913;
    }
  }
  plVar1 = *(long **)((k->super_array<unsigned_char,_128UL>)._M_elems + 0x10);
  (**(code **)(*plVar1 + 0x20))(local_a8,plVar1,_Var2._M_head_impl);
  (this->super_KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>).
  _vptr_KeyValueStorage = (_func_int **)local_28._M_head_impl;
  local_28._M_head_impl = (uchar *)0x0;
  *(undefined1 *)
   &(this->innerStorage_)._M_t.
    super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
    .
    super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_false>
    ._M_head_impl = 1;
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_28);
  uVar3 = extraout_RDX_00;
LAB_00186913:
  oVar5.super__Optional_base<supermap::ByteArray<4096UL>,_false,_false>._M_payload.
  super__Optional_payload<supermap::ByteArray<4096UL>,_true,_false,_false>.
  super__Optional_payload_base<supermap::ByteArray<4096UL>_>._8_8_ = uVar3;
  oVar5.super__Optional_base<supermap::ByteArray<4096UL>,_false,_false>._M_payload.
  super__Optional_payload<supermap::ByteArray<4096UL>,_true,_false,_false>.
  super__Optional_payload_base<supermap::ByteArray<4096UL>_>._M_payload =
       (_Storage<supermap::ByteArray<4096UL>,_false>)this;
  return (optional<supermap::ByteArray<4096UL>_>)
         oVar5.super__Optional_base<supermap::ByteArray<4096UL>,_false,_false>._M_payload.
         super__Optional_payload<supermap::ByteArray<4096UL>,_true,_false,_false>.
         super__Optional_payload_base<supermap::ByteArray<4096UL>_>;
}

Assistant:

std::optional<Value> getValue(const Key &k) override {
        IndexT index;
        if (auto optIndex = innerStorage_->getValue(k); optIndex.has_value()) {
            index = optIndex.value();
        } else {
            std::optional<KeyIndex> foundOnDisk = diskIndex_->find(
                k,
                [](const KeyIndex &ki, const Key &key) { return ki.key < key; },
                [](const KeyIndex &ki, const Key &key) { return ki.key == key; }
            );
            if (!foundOnDisk.has_value()) {
                return std::nullopt;
            }
            index = foundOnDisk.value().value;
        }
        return std::optional{diskDataStorage_->get(index).value};
    }